

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::UniformLocImplicitInSomeStages::Run(UniformLocImplicitInSomeStages *this)

{
  long lVar1;
  Loc _location;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  local_298;
  UniformType local_278;
  Uniform local_1e8;
  
  local_298.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UniformType::UniformType(&local_278,0x1406,0);
  _location.super_LayoutSpecifierBase.occurence.occurence = FSH_OR_CSH;
  _location.super_LayoutSpecifierBase.val = 3;
  _location.super_LayoutSpecifierBase.numSys = Dec;
  Uniform::Uniform(&local_1e8,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
                   &local_278,_location,(DefOccurence)0x0,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&local_298,&local_1e8);
  Uniform::~Uniform(&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.refStrType._M_dataplus._M_p != &local_278.refStrType.field_2) {
    operator_delete(local_278.refStrType._M_dataplus._M_p,
                    local_278.refStrType.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.strType._M_dataplus._M_p != &local_278.strType.field_2) {
    operator_delete(local_278.strType._M_dataplus._M_p,
                    local_278.strType.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::~vector(&local_278.childTypes);
  if (local_278.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.arraySizesSegmented.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.arraySizesSegmented.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,&local_298);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector(&local_298);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		//One shader: uniform float u0;
		//Another shader: layout (location = 3) uniform float  u0;
		std::vector<Uniform> uniforms;
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(3, DefOccurence::FSH_OR_CSH)));
		return doRun(uniforms);
	}